

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

size_t stb_filelen(FILE *f)

{
  long __off;
  size_t sVar1;
  
  __off = ftell((FILE *)f);
  fseek((FILE *)f,0,2);
  sVar1 = ftell((FILE *)f);
  fseek((FILE *)f,__off,0);
  return sVar1;
}

Assistant:

size_t  stb_filelen(FILE *f)
{
   size_t len, pos;
   pos = ftell(f);
   fseek(f, 0, SEEK_END);
   len = ftell(f);
   fseek(f, pos, SEEK_SET);
   return len;
}